

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<int,_int,_int,_duckdb::UpperInclusiveBetweenOperator,_false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  int *piVar1;
  int *adata_00;
  idx_t iVar2;
  SelectionVector *pSVar3;
  SelectionVector *in_RCX;
  UnifiedVectorFormat *in_RDX;
  SelectionVector *unaff_RBX;
  UnifiedVectorFormat *in_RSI;
  UnifiedVectorFormat *in_RDI;
  SelectionVector *in_R8;
  long in_R9;
  long in_stack_00000008;
  SelectionVector *in_stack_ffffffffffffff78;
  idx_t in_stack_ffffffffffffff80;
  SelectionVector *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  SelectionVector *in_stack_ffffffffffffffd8;
  
  if ((in_R9 == 0) || (in_stack_00000008 == 0)) {
    if (in_R9 == 0) {
      pSVar3 = (SelectionVector *)UnifiedVectorFormat::GetData<int>(in_RDI);
      piVar1 = UnifiedVectorFormat::GetData<int>(in_RSI);
      UnifiedVectorFormat::GetData<int>(in_RDX);
      iVar2 = SelectLoop<int,_int,_int,_duckdb::UpperInclusiveBetweenOperator,_false,_false,_true>
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(idx_t)piVar1,pSVar3,
                         in_R8,in_RCX,(ValidityMask *)in_RDX,(ValidityMask *)in_RSI,
                         (ValidityMask *)in_RDI,in_stack_ffffffffffffffd8,unaff_RBX);
    }
    else {
      pSVar3 = (SelectionVector *)UnifiedVectorFormat::GetData<int>(in_RDI);
      piVar1 = UnifiedVectorFormat::GetData<int>(in_RSI);
      UnifiedVectorFormat::GetData<int>(in_RDX);
      iVar2 = SelectLoop<int,_int,_int,_duckdb::UpperInclusiveBetweenOperator,_false,_true,_false>
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,piVar1,pSVar3,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_R8,in_RCX,
                         (ValidityMask *)in_RDX,(ValidityMask *)in_RSI,(ValidityMask *)in_RDI,
                         in_stack_ffffffffffffffd8,unaff_RBX);
    }
  }
  else {
    piVar1 = UnifiedVectorFormat::GetData<int>(in_RDI);
    adata_00 = UnifiedVectorFormat::GetData<int>(in_RSI);
    UnifiedVectorFormat::GetData<int>(in_RDX);
    iVar2 = SelectLoop<int,_int,_int,_duckdb::UpperInclusiveBetweenOperator,_false,_true,_true>
                      (adata_00,piVar1,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_R8,in_RCX,
                       (ValidityMask *)in_RDX,(ValidityMask *)in_RSI,(ValidityMask *)in_RDI,
                       in_stack_ffffffffffffffd8,unaff_RBX);
  }
  return iVar2;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}